

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUITabControl::setActiveTab(CGUITabControl *this,s32 idx)

{
  u32 uVar1;
  s32 sVar2;
  uint in_ESI;
  CGUITabControl *in_RDI;
  SEvent event;
  bool changed;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  uint uVar4;
  bool local_1;
  
  uVar4 = in_ESI;
  uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3d198b);
  if (in_ESI < uVar1) {
    uVar3 = CONCAT13(in_RDI->ActiveTabIndex != uVar4,(int3)in_stack_ffffffffffffffe8);
    in_RDI->ActiveTabIndex = uVar4;
    setVisibleTab((CGUITabControl *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_ESI);
    if (((uVar3 & 0x1000000) != 0) && (*(long *)&in_RDI->field_0x20 != 0)) {
      (**(code **)(**(long **)&in_RDI->field_0x20 + 0x10))
                (*(long **)&in_RDI->field_0x20,&stack0xffffffffffffffb0);
    }
    if ((in_RDI->ScrollControl & 1U) != 0) {
      sVar2 = calculateScrollIndexFromActive((CGUITabControl *)CONCAT44(uVar4,uVar3));
      in_RDI->CurrentScrollTabIndex = sVar2;
      recalculateScrollBar(in_RDI);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CGUITabControl::setActiveTab(s32 idx)
{
	if ((u32)idx >= Tabs.size())
		return false;

	bool changed = (ActiveTabIndex != idx);

	ActiveTabIndex = idx;

	setVisibleTab(ActiveTabIndex);

	if (changed && Parent) {
		SEvent event;
		event.EventType = EET_GUI_EVENT;
		event.GUIEvent.Caller = this;
		event.GUIEvent.Element = 0;
		event.GUIEvent.EventType = EGET_TAB_CHANGED;
		Parent->OnEvent(event);
	}

	if (ScrollControl) {
		CurrentScrollTabIndex = calculateScrollIndexFromActive();
		recalculateScrollBar();
	}

	return true;
}